

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

int xattr_new(archive_read *a,xar *xar,xmlattr_list *list)

{
  char *p;
  int iVar1;
  xattr *pxVar2;
  size_t char_cnt;
  uint64_t uVar3;
  xmlattr *local_40;
  xmlattr *attr;
  xattr **nx;
  xattr *xattr;
  xmlattr_list *list_local;
  xar *xar_local;
  archive_read *a_local;
  
  pxVar2 = (xattr *)calloc(1,0xb0);
  if (pxVar2 == (xattr *)0x0) {
    archive_set_error(&a->archive,0xc,"Out of memory");
    a_local._4_4_ = -0x1e;
  }
  else {
    xar->xattr = pxVar2;
    for (local_40 = list->first; local_40 != (xmlattr *)0x0; local_40 = local_40->next) {
      iVar1 = strcmp(local_40->name,"id");
      if (iVar1 == 0) {
        p = local_40->value;
        char_cnt = strlen(local_40->value);
        uVar3 = atol10(p,char_cnt);
        pxVar2->id = uVar3;
      }
    }
    attr = (xmlattr *)&xar->file->xattr_list;
    while ((attr->next != (xmlattr *)0x0 && (attr->next[1].name <= (char *)pxVar2->id))) {
      attr = attr->next;
    }
    pxVar2->next = (xattr *)attr->next;
    attr->next = (xmlattr *)pxVar2;
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
xattr_new(struct archive_read *a, struct xar *xar, struct xmlattr_list *list)
{
	struct xattr *xattr, **nx;
	struct xmlattr *attr;

	xattr = calloc(1, sizeof(*xattr));
	if (xattr == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Out of memory");
		return (ARCHIVE_FATAL);
	}
	xar->xattr = xattr;
	for (attr = list->first; attr != NULL; attr = attr->next) {
		if (strcmp(attr->name, "id") == 0)
			xattr->id = atol10(attr->value, strlen(attr->value));
	}
	/* Chain to xattr list. */
	for (nx = &(xar->file->xattr_list);
	    *nx != NULL; nx = &((*nx)->next)) {
		if (xattr->id < (*nx)->id)
			break;
	}
	xattr->next = *nx;
	*nx = xattr;

	return (ARCHIVE_OK);
}